

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtVM.c
# Opt level: O0

void NVMInitGlobalVars(void)

{
  newtRefVar nVar1;
  newtRef nVar2;
  
  nVar1 = newt_sym.printDepth;
  nVar2 = NewtMakeInteger(3);
  NsDefGlobalVar(2,nVar1,nVar2);
  nVar1 = newt_sym.printIndent;
  nVar2 = NewtMakeInteger(1);
  NsDefGlobalVar(2,nVar1,nVar2);
  nVar1 = newt_sym.printLength;
  nVar2 = NewtMakeInteger(10);
  NsDefGlobalVar(2,nVar1,nVar2);
  nVar1 = newt_sym.printBinaries;
  nVar2 = NewtMakeInteger(0);
  NsDefGlobalVar(2,nVar1,nVar2);
  nVar1 = newt_sym.printUnique;
  nVar2 = NewtMakeInteger(0);
  NsDefGlobalVar(2,nVar1,nVar2);
  NsDefGlobalVar(2,newt_sym._STDOUT_,2);
  NsDefGlobalVar(2,newt_sym._STDERR_,2);
  return;
}

Assistant:

void NVMInitGlobalVars(void)
{
    NcDefGlobalVar(NSSYM0(printDepth), NSINT(3));
    NcDefGlobalVar(NSSYM0(printIndent), NSINT(1));
    NcDefGlobalVar(NSSYM0(printLength), NSINT(10));
    NcDefGlobalVar(NSSYM0(printBinaries), NSINT(0));
    NcDefGlobalVar(NSSYM0(printUnique), NSINT(0));

    NcDefGlobalVar(NSSYM0(_STDOUT_), kNewtRefNIL);
    NcDefGlobalVar(NSSYM0(_STDERR_), kNewtRefNIL);
}